

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_symbols.cxx
# Opt level: O1

void draw_circle(Fl_Color col)

{
  Fl_Color FVar1;
  
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,col);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1b])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])(0,0,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x25])();
  FVar1 = fl_color_average(col,0x38,0.67);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])(fl_graphics_driver,(ulong)FVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1a])();
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x1e])(0,0,0x3ff0000000000000);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x24])();
  return;
}

Assistant:

static void draw_circle(Fl_Color col) {
  fl_color(col); BP; fl_circle(0,0,1); EP;
  set_outline_color(col);
  BC; fl_circle(0,0,1); EC;
}